

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

int choose_cat_from_present<InputData<double,long>,WorkerMemory<ImputedData<long,double>,double,double>>
              (WorkerMemory<ImputedData<long,_double>,_double,_double> *workspace,
              InputData<double,_long> *input_data,size_t col_num)

{
  int *piVar1;
  pointer pcVar2;
  result_type_conflict rVar3;
  long lVar4;
  param_type local_28;
  
  lVar4 = 0;
  local_28 = (param_type)((ulong)((int)workspace->npresent - 1) << 0x20);
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_28,&workspace->rnd_generator,&local_28)
  ;
  workspace->ncat_tried = 0;
  piVar1 = input_data->ncat;
  if (0 < piVar1[col_num]) {
    pcVar2 = (workspace->categs).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if ('\0' < pcVar2[lVar4]) {
        if (workspace->ncat_tried == rVar3) break;
        workspace->ncat_tried = workspace->ncat_tried + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < piVar1[col_num]);
  }
  return (int)lVar4;
}

Assistant:

int choose_cat_from_present(WorkerMemory &workspace, InputData &input_data, size_t col_num)
{
    int chosen_cat = std::uniform_int_distribution<int>
                                    (0, workspace.npresent - 1)
                                    (workspace.rnd_generator);
    workspace.ncat_tried = 0;
    for (int cat = 0; cat < input_data.ncat[col_num]; cat++)
    {
        if (workspace.categs[cat] > 0)
        {
            if (workspace.ncat_tried == chosen_cat)
                return cat;
            else
                workspace.ncat_tried++;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}